

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O3

void __thiscall compressed_sparse_matrix<int>::push_back(compressed_sparse_matrix<int> *this,int e)

{
  int *piVar1;
  _Elt_pointer puVar2;
  int local_c;
  
  piVar1 = (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar1 == (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    local_c = e;
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&this->entries,&local_c);
  }
  else {
    *piVar1 = e;
    (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_cur = piVar1 + 1;
  }
  puVar2 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (puVar2 == (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    puVar2 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  puVar2[-1] = puVar2[-1] + 1;
  return;
}

Assistant:

void push_back(ValueType e) {
		assert(0 < size());
		entries.push_back(e);
		++bounds.back();
	}